

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O0

void __thiscall timer_group_context::onTaskAdded(timer_group_context *this,task_handle *hTask)

{
  timing_registry *this_00;
  task_group_base *this_01;
  task_uid guid;
  task_handle local_28;
  task_handle *local_18;
  task_handle *hTask_local;
  timer_group_context *this_local;
  
  local_18 = hTask;
  hTask_local = (task_handle *)this;
  this_00 = timing_registry::get();
  this_01 = oqpi::group_context_base::owner(&this->super_group_context_base);
  guid = oqpi::task_base::getUID(&this_01->super_task_base);
  oqpi::task_handle::task_handle(&local_28,local_18);
  timing_registry::addToGroup(this_00,guid,&local_28);
  oqpi::task_handle::~task_handle(&local_28);
  return;
}

Assistant:

inline void onTaskAdded(const oqpi::task_handle &hTask)
    {
        timing_registry::get().addToGroup(this->owner()->getUID(), hTask);
    }